

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.h
# Opt level: O0

NormalizerSpec * __thiscall
sentencepiece::ModelProto::_internal_mutable_normalizer_spec(ModelProto *this)

{
  NormalizerSpec *pNVar1;
  long in_RDI;
  NormalizerSpec *p;
  MessageLite *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x28) = *(uint *)(in_RDI + 0x28) | 2;
  if (*(long *)(in_RDI + 0x50) == 0) {
    google::protobuf::MessageLite::GetArena(in_stack_ffffffffffffffe0);
    pNVar1 = google::protobuf::MessageLite::CreateMaybeMessage<sentencepiece::NormalizerSpec>
                       ((Arena *)0x3f4481);
    *(NormalizerSpec **)(in_RDI + 0x50) = pNVar1;
  }
  return *(NormalizerSpec **)(in_RDI + 0x50);
}

Assistant:

inline ::sentencepiece::NormalizerSpec* ModelProto::_internal_mutable_normalizer_spec() {
  _has_bits_[0] |= 0x00000002u;
  if (normalizer_spec_ == nullptr) {
    auto* p = CreateMaybeMessage<::sentencepiece::NormalizerSpec>(GetArena());
    normalizer_spec_ = p;
  }
  return normalizer_spec_;
}